

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int read_next_symbol(archive_read *a,huffman_code *code)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  huffman_table_entry *table;
  int iVar5;
  uint uVar6;
  
  if (code->table == (huffman_table_entry *)0x0) {
    iVar2 = code->maxlength;
    iVar5 = 10;
    if (iVar2 < 10) {
      iVar5 = iVar2;
    }
    if (iVar2 < code->minlength) {
      iVar5 = 10;
    }
    code->tablesize = iVar5;
    table = (huffman_table_entry *)calloc(1L << ((byte)iVar5 & 0x3f),8);
    code->table = table;
    iVar2 = make_table_recurse(a,code,0,table,0,iVar5);
    if (iVar2 != 0) {
      return -1;
    }
  }
  pvVar1 = a->format->data;
  if (((*(int *)((long)pvVar1 + 0x4f38) < code->tablesize) &&
      (iVar2 = rar_br_fillup(a,(rar_br *)((long)pvVar1 + 0x4f30)), iVar2 == 0)) &&
     (*(int *)((long)pvVar1 + 0x4f38) < code->tablesize)) {
LAB_0014505a:
    archive_set_error(&a->archive,0x54,"Truncated RAR file data");
    *(undefined1 *)((long)pvVar1 + 0xd0) = 0;
  }
  else {
    iVar2 = code->tablesize;
    iVar5 = *(int *)((long)pvVar1 + 0x4f38) - iVar2;
    uVar3 = (uint)(*(ulong *)((long)pvVar1 + 0x4f30) >> ((byte)iVar5 & 0x3f)) & cache_masks[iVar2];
    uVar6 = code->table[uVar3].length;
    if (-1 < (int)uVar6) {
      iVar4 = code->table[uVar3].value;
      if ((int)uVar6 <= iVar2) {
        *(uint *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) - uVar6;
        return iVar4;
      }
      *(int *)((long)pvVar1 + 0x4f38) = iVar5;
      do {
        iVar2 = code->tree[iVar4].branches[0];
        if (iVar2 == code->tree[iVar4].branches[1]) {
          return iVar2;
        }
        if (((*(int *)((long)pvVar1 + 0x4f38) < 1) &&
            (iVar2 = rar_br_fillup(a,(rar_br *)((long)pvVar1 + 0x4f30)), iVar2 == 0)) &&
           (*(int *)((long)pvVar1 + 0x4f38) < 1)) goto LAB_0014505a;
        uVar6 = *(int *)((long)pvVar1 + 0x4f38) - 1;
        *(uint *)((long)pvVar1 + 0x4f38) = uVar6;
        iVar4 = code->tree[iVar4].branches
                [(*(ulong *)((long)pvVar1 + 0x4f30) >> ((ulong)uVar6 & 0x3f) & 1) != 0];
      } while (-1 < iVar4);
    }
    archive_set_error(&a->archive,0x54,"Invalid prefix code in bitstream");
  }
  return -1;
}

Assistant:

static int
read_next_symbol(struct archive_read *a, struct huffman_code *code)
{
  unsigned char bit;
  unsigned int bits;
  int length, value, node;
  struct rar *rar;
  struct rar_br *br;

  if (!code->table)
  {
    if (make_table(a, code) != (ARCHIVE_OK))
      return -1;
  }

  rar = (struct rar *)(a->format->data);
  br = &(rar->br);

  /* Look ahead (peek) at bits */
  if (!rar_br_read_ahead(a, br, code->tablesize)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Truncated RAR file data");
    rar->valid = 0;
    return -1;
  }
  bits = rar_br_bits(br, code->tablesize);

  length = code->table[bits].length;
  value = code->table[bits].value;

  if (length < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid prefix code in bitstream");
    return -1;
  }

  if (length <= code->tablesize)
  {
    /* Skip length bits */
    rar_br_consume(br, length);
    return value;
  }

  /* Skip tablesize bits */
  rar_br_consume(br, code->tablesize);

  node = value;
  while (code->tree[node].branches[0] != code->tree[node].branches[1])
  {
    if (!rar_br_read_ahead(a, br, 1)) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Truncated RAR file data");
      rar->valid = 0;
      return -1;
    }
    bit = rar_br_bits(br, 1);
    rar_br_consume(br, 1);

    if (code->tree[node].branches[bit] < 0)
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Invalid prefix code in bitstream");
      return -1;
    }
    node = code->tree[node].branches[bit];
  }

  return code->tree[node].branches[0];
}